

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

bool chaiscript::dispatch::detail::
     compare_types_cast<std::__cxx11::string,chaiscript::Boxed_Value_const&>
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Boxed_Value_ptr
                *param_1,Function_Params *params,Type_Conversions_State *t_conversions)

{
  chaiscript local_10 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8;
  
  boxed_cast<chaiscript::Boxed_Value_const&>(local_10,params->m_begin,t_conversions);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8);
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }